

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O2

void __thiscall MyProgress::beginorder(MyProgress *this,Graph *param_1,Float cost)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  string local_30 [32];
  
  poVar3 = std::operator<<((ostream *)&std::cerr,"f = ");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 8) = 6;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,cost);
  poVar3 = std::operator<<(poVar3," { ");
  now_abi_cxx11_();
  std::operator<<(poVar3,local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void beginorder(const Graph*, Float cost) const
  {
    std::cerr << "f = " << std::fixed << std::setprecision(6) << cost << " { " << now();
  }